

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pbrt::SpectrumTexture_const&,pbrt::SpectrumTexture_const&,pbrt::SpectrumTexture_const&,pbrt::FloatTexture_const&,pbrt::FloatTexture_const&,float_const&,float_const&,bool_const&>
               (string *s,char *fmt,SpectrumTexture *v,SpectrumTexture *args,SpectrumTexture *args_1
               ,FloatTexture *args_2,FloatTexture *args_3,float *args_4,float *args_5,bool *args_6)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char *in_RCX;
  string *in_RDX;
  float *unaff_RBX;
  string *in_RDI;
  SpectrumTexture *in_R8;
  SpectrumTexture *in_R9;
  bool *unaff_retaddr;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  SpectrumTexture *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffda0;
  char **in_stack_fffffffffffffda8;
  char **in_stack_fffffffffffffdb0;
  SpectrumTexture *in_stack_fffffffffffffdb8;
  ostream *in_stack_fffffffffffffdc0;
  string local_218 [32];
  stringstream local_1f8 [32];
  char *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  LogLevel in_stack_fffffffffffffe44;
  string local_58 [16];
  FloatTexture *in_stack_ffffffffffffffb8;
  FloatTexture *in_stack_ffffffffffffffc0;
  
  copyToFormatString(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  lVar1 = std::__cxx11::string::find((char)local_58,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_58,0x73);
  lVar3 = std::__cxx11::string::find((char)local_58,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
             in_stack_fffffffffffffe28);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
             in_stack_fffffffffffffe28);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
               in_stack_fffffffffffffe28);
    }
    std::__cxx11::string::c_str();
    formatOne<pbrt::SpectrumTexture_const&>(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffda0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffda0);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1f8);
    pbrt::operator<<(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    formatOne<char_const*>((char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    std::__cxx11::string::operator+=(in_RDI,local_218);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
    std::__cxx11::stringstream::~stringstream(local_1f8);
  }
  stringPrintfRecursive<pbrt::SpectrumTexture_const&,pbrt::SpectrumTexture_const&,pbrt::FloatTexture_const&,pbrt::FloatTexture_const&,float_const&,float_const&,bool_const&>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (float *)in_RDI,unaff_RBX,unaff_retaddr);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}